

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O0

void __thiscall OSTEI_HRR_Writer::WriteHRR_Bra_External_(OSTEI_HRR_Writer *this,ostream *os,QAM *am)

{
  char *pcVar1;
  bool bVar2;
  RRStepType RVar3;
  int iVar4;
  ostream *poVar5;
  int *piVar6;
  long in_RDX;
  ostream *in_RSI;
  DAM *it;
  iterator __end1;
  iterator __begin1;
  DAMSet *__range1;
  RRStepType rrstep;
  string *in_stack_fffffffffffffca8;
  int i;
  QAM *in_stack_fffffffffffffcb0;
  undefined8 in_stack_fffffffffffffcb8;
  QAM *in_stack_fffffffffffffcc0;
  QAM *in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  OSTEI_HRR_Algorithm_Base *in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  string local_1f0 [32];
  string local_1d0 [80];
  string local_180 [32];
  reference local_160;
  _Self local_158;
  _Self local_150;
  allocator local_141;
  string local_140 [72];
  undefined1 local_f8 [48];
  undefined1 *local_c8;
  string local_c0 [32];
  string local_a0 [55];
  allocator local_69;
  string local_68 [76];
  RRStepType local_1c;
  ostream *local_10;
  
  local_10 = in_RSI;
  QAM::operator[](in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
  QAM::operator[](in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"",&local_69);
  DAM::DAM((DAM *)in_stack_fffffffffffffcc0,(int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
           (int)in_stack_fffffffffffffcb8,(string *)in_stack_fffffffffffffcb0);
  RVar3 = OSTEI_HRR_Algorithm_Base::GetBraRRStep
                    (in_stack_fffffffffffffd10,
                     (DAM *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  DAM::~DAM((DAM *)0x14c024);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_1c = RVar3;
  poVar5 = std::operator<<(local_10,(string *)indent4_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"HRR_");
  RRStepTypeToStr_abi_cxx11_((RRStepType)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
  poVar5 = std::operator<<(poVar5,local_a0);
  poVar5 = std::operator<<(poVar5,"_");
  pcVar1 = amchar;
  piVar6 = QAM::operator[](in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20)
                          );
  poVar5 = std::operator<<(poVar5,pcVar1[*piVar6]);
  poVar5 = std::operator<<(poVar5,"_");
  pcVar1 = amchar;
  piVar6 = QAM::operator[](in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20)
                          );
  poVar5 = std::operator<<(poVar5,pcVar1[*piVar6]);
  std::operator<<(poVar5,"(\n");
  std::__cxx11::string::~string(local_a0);
  poVar5 = std::operator<<(local_10,(string *)indent5_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"");
  HRRVarName_abi_cxx11_(in_stack_fffffffffffffcf8);
  poVar5 = std::operator<<(poVar5,local_c0);
  std::operator<<(poVar5,",\n");
  std::__cxx11::string::~string(local_c0);
  QAM::operator[](in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
  QAM::operator[](in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"",&local_141);
  DAM::DAM((DAM *)in_stack_fffffffffffffcc0,(int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
           (int)in_stack_fffffffffffffcb8,(string *)in_stack_fffffffffffffcb0);
  OSTEI_HRR_Algorithm_Base::GetBraAMReq
            ((OSTEI_HRR_Algorithm_Base *)
             CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
             (DAM *)in_stack_fffffffffffffd10);
  DAM::~DAM((DAM *)0x14c315);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  local_c8 = local_f8;
  local_150._M_node =
       (_Base_ptr)
       std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>::begin
                 ((set<DAM,_std::less<DAM>,_std::allocator<DAM>_> *)in_stack_fffffffffffffca8);
  local_158._M_node =
       (_Base_ptr)
       std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>::end
                 ((set<DAM,_std::less<DAM>,_std::allocator<DAM>_> *)in_stack_fffffffffffffca8);
  while( true ) {
    bVar2 = std::operator!=(&local_150,&local_158);
    if (!bVar2) break;
    local_160 = std::_Rb_tree_const_iterator<DAM>::operator*
                          ((_Rb_tree_const_iterator<DAM> *)0x14c4c9);
    poVar5 = std::operator<<(local_10,(string *)indent5_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,"");
    DAM::operator[]((DAM *)in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20)
                   );
    DAM::operator[]((DAM *)in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20)
                   );
    QAM::operator[](in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
    QAM::operator[](in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
    std::__cxx11::string::string(local_1d0,(string *)(in_RDX + 0x10));
    QAM::QAM(in_stack_fffffffffffffcc0,(int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
             (int)in_stack_fffffffffffffcb8,(int)((ulong)in_stack_fffffffffffffcb0 >> 0x20),
             (int)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    HRRVarName_abi_cxx11_(in_stack_fffffffffffffcf8);
    poVar5 = std::operator<<(poVar5,local_180);
    std::operator<<(poVar5,",\n");
    std::__cxx11::string::~string(local_180);
    QAM::~QAM((QAM *)0x14c64f);
    std::__cxx11::string::~string(local_1d0);
    std::_Rb_tree_const_iterator<DAM>::operator++
              ((_Rb_tree_const_iterator<DAM> *)in_stack_fffffffffffffcb0);
  }
  std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>::~set
            ((set<DAM,_std::less<DAM>,_std::allocator<DAM>_> *)0x14c393);
  i = (int)((ulong)in_stack_fffffffffffffca8 >> 0x20);
  RVar3 = (RRStepType)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
  poVar5 = std::operator<<(local_10,(string *)indent5_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"hAB, ");
  piVar6 = QAM::operator[](in_stack_fffffffffffffcb0,i);
  iVar4 = *piVar6;
  piVar6 = QAM::operator[](in_stack_fffffffffffffcb0,i);
  iVar4 = NCART(iVar4,*piVar6);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
  std::operator<<(poVar5,");\n");
  poVar5 = std::operator<<((ostream *)&std::cout,"SIMINT EXTERNAL HRR ");
  RRStepTypeToStr_abi_cxx11_(RVar3);
  poVar5 = std::operator<<(poVar5,local_1f0);
  poVar5 = std::operator<<(poVar5," ");
  piVar6 = QAM::operator[](in_stack_fffffffffffffcb0,i);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*piVar6);
  poVar5 = std::operator<<(poVar5," ");
  piVar6 = QAM::operator[](in_stack_fffffffffffffcb0,i);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*piVar6);
  std::operator<<(poVar5,"\n");
  std::__cxx11::string::~string(local_1f0);
  return;
}

Assistant:

void OSTEI_HRR_Writer::WriteHRR_Bra_External_(std::ostream & os, QAM am) const
{
    // call function
    RRStepType rrstep = hrr_algo_.GetBraRRStep({am[0], am[1]});
    os << indent4 << "HRR_" << RRStepTypeToStr(rrstep) << "_"
       << amchar[am[0]] << "_" << amchar[am[1]] << "(\n";

    // pointer to result buffer
    os << indent5 << "" << HRRVarName(am) << ",\n";

    // pointer to requirements
    for(const auto & it : hrr_algo_.GetBraAMReq({am[0], am[1]}))
        os << indent5 << "" << HRRVarName({it[0], it[1], am[2], am[3], am.tag}) << ",\n";

    os << indent5 << "hAB, " << NCART(am[2], am[3]) << ");\n"; 

    // Mark this as required in the log file
    std::cout << "SIMINT EXTERNAL HRR " << RRStepTypeToStr(rrstep)
              << " " << am[0] << " " << am[1] << "\n";
}